

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_impl.hpp
# Opt level: O0

void * __thiscall
boost::detail::
sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
::get_deleter(sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
              *this,sp_typeinfo *ti)

{
  bool bVar1;
  type_info *in_RSI;
  type_info *in_RDI;
  type_info *local_20;
  
  bVar1 = std::type_info::operator==(in_RSI,in_RDI);
  if (bVar1) {
    local_20 = in_RDI + 0x18;
  }
  else {
    local_20 = (type_info *)0x0;
  }
  return local_20;
}

Assistant:

virtual void * get_deleter( sp_typeinfo const & ti )
    {
        return ti == BOOST_SP_TYPEID(D)? &reinterpret_cast<char&>( del ): 0;
    }